

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.cc
# Opt level: O0

unordered_map<unsigned_long,_testing::internal::CallReaction,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_testing::internal::CallReaction>_>_>
* testing::anon_unknown_6::UninterestingCallReactionMap(void)

{
  int iVar1;
  unordered_map<unsigned_long,_testing::internal::CallReaction,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_testing::internal::CallReaction>_>_>
  *this;
  
  if ((anonymous_namespace)::UninterestingCallReactionMap()::map == '\0') {
    iVar1 = __cxa_guard_acquire(&(anonymous_namespace)::UninterestingCallReactionMap()::map);
    if (iVar1 != 0) {
      this = (unordered_map<unsigned_long,_testing::internal::CallReaction,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_testing::internal::CallReaction>_>_>
              *)operator_new(0x38);
      std::
      unordered_map<unsigned_long,_testing::internal::CallReaction,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_testing::internal::CallReaction>_>_>
      ::unordered_map(this);
      UninterestingCallReactionMap::map = this;
      __cxa_guard_release(&(anonymous_namespace)::UninterestingCallReactionMap()::map);
    }
  }
  return UninterestingCallReactionMap::map;
}

Assistant:

std::unordered_map<uintptr_t, internal::CallReaction>&
UninterestingCallReactionMap() {
  static auto* map = new std::unordered_map<uintptr_t, internal::CallReaction>;
  return *map;
}